

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O3

bool GlobOpt::CompareCurrentTypesWithExpectedTypes
               (JsTypeValueInfo *valueInfo,PropertySymOpnd *propertySymOpnd)

{
  code *pcVar1;
  anon_union_2_2_18881db1_for_PropertySymOpnd_13 aVar2;
  bool bVar3;
  JITTypeHolder JVar4;
  undefined4 *puVar5;
  EquivalentTypeSet *pEVar6;
  JITTypeHolderBase<void> *pIndex;
  bool bVar7;
  JITTypeHolderBase<void> local_40;
  JITTypeHolderBase<void> local_38;
  uint16 checkedTypeSetIndex;
  
  aVar2 = (anon_union_2_2_18881db1_for_PropertySymOpnd_13)
          (propertySymOpnd->field_12).objTypeSpecFlags;
  bVar7 = ((ushort)aVar2 & 0x400) == 0;
  if (valueInfo != (JsTypeValueInfo *)0x0) {
    local_38.t = (valueInfo->jsType).t;
    local_40.t = (Type)0x0;
    bVar3 = JITTypeHolderBase<void>::operator==(&local_38,&local_40.t);
    if ((!bVar3) || (valueInfo->jsTypeSet != (EquivalentTypeSet *)0x0)) {
      if ((propertySymOpnd->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
         ((bVar3 = ObjTypeSpecFldInfo::HasEquivalentTypeSet(propertySymOpnd->objTypeSpecFldInfo),
          !bVar3 || (bVar3 = IR::PropertySymOpnd::NeedsMonoCheck(propertySymOpnd), bVar3)))) {
        JVar4 = IR::PropertySymOpnd::GetType(propertySymOpnd);
        local_38.t = (valueInfo->jsType).t;
        local_40.t = (Type)0x0;
        bVar3 = JITTypeHolderBase<void>::operator!=(&local_38,&local_40.t);
        if (bVar3) {
          local_38.t = (valueInfo->jsType).t;
          local_40.t = (Type)IR::PropertySymOpnd::GetType(propertySymOpnd);
          bVar7 = JITTypeHolderBase<void>::operator==(&local_38,&local_40);
          if (bVar7) {
            return true;
          }
          bVar7 = IR::PropertySymOpnd::HasInitialType(propertySymOpnd);
          if (bVar7) {
            local_38.t = (valueInfo->jsType).t;
            local_40.t = (Type)IR::PropertySymOpnd::GetInitialType(propertySymOpnd);
            bVar7 = JITTypeHolderBase<void>::operator==(&local_38,&local_40);
            return bVar7 && ((ushort)aVar2 & 0x400) == 0;
          }
        }
        else {
          pEVar6 = valueInfo->jsTypeSet;
          if (pEVar6 == (EquivalentTypeSet *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                               ,0x449,"(valueInfo->GetJsTypeSet())","valueInfo->GetJsTypeSet()");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar5 = 0;
            pEVar6 = valueInfo->jsTypeSet;
          }
          bVar3 = Js::EquivalentTypeSet::Contains(pEVar6,JVar4,(uint16 *)0x0);
          if (bVar3) {
            return bVar7;
          }
          bVar7 = IR::PropertySymOpnd::HasInitialType(propertySymOpnd);
          if (bVar7) {
            JVar4 = IR::PropertySymOpnd::GetInitialType(propertySymOpnd);
            bVar7 = Js::EquivalentTypeSet::Contains(pEVar6,JVar4,(uint16 *)0x0);
            return bVar7 && ((ushort)aVar2 & 0x400) == 0;
          }
        }
        bVar7 = false;
      }
      else {
        pEVar6 = IR::PropertySymOpnd::GetEquivalentTypeSet(propertySymOpnd);
        local_38.t = (valueInfo->jsType).t;
        local_40.t = (Type)0x0;
        bVar7 = JITTypeHolderBase<void>::operator!=(&local_38,&local_40.t);
        if (bVar7) {
          JVar4.t = (valueInfo->jsType).t;
          pIndex = &local_38;
        }
        else {
          bVar7 = Js::EquivalentTypeSet::IsSubsetOf(valueInfo->jsTypeSet,pEVar6);
          if (bVar7) {
            return true;
          }
          if ((propertySymOpnd->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
             (bVar7 = ObjTypeSpecFldInfo::IsMono(propertySymOpnd->objTypeSpecFldInfo), !bVar7)) {
            bVar7 = Js::EquivalentTypeSet::IsSubsetOf(pEVar6,valueInfo->jsTypeSet);
            return bVar7;
          }
          pEVar6 = valueInfo->jsTypeSet;
          JVar4 = IR::PropertySymOpnd::GetFirstEquivalentType(propertySymOpnd);
          pIndex = (JITTypeHolderBase<void> *)0x0;
        }
        bVar7 = Js::EquivalentTypeSet::Contains(pEVar6,JVar4,(uint16 *)pIndex);
      }
    }
  }
  return bVar7;
}

Assistant:

bool
GlobOpt::CompareCurrentTypesWithExpectedTypes(JsTypeValueInfo *valueInfo, IR::PropertySymOpnd * propertySymOpnd)
{
    bool isTypeDead = propertySymOpnd->IsTypeDead();

    if (valueInfo == nullptr || (valueInfo->GetJsType() == nullptr && valueInfo->GetJsTypeSet() == nullptr))
    {
        // No upstream types. Do a type check.
        return !isTypeDead;
    }

    if (!propertySymOpnd->HasEquivalentTypeSet() || propertySymOpnd->NeedsMonoCheck())
    {
        JITTypeHolder opndType = propertySymOpnd->GetType();

        if (valueInfo->GetJsType() != nullptr)
        {
            if (valueInfo->GetJsType() == propertySymOpnd->GetType())
            {
                return true;
            }
            if (propertySymOpnd->HasInitialType() && valueInfo->GetJsType() == propertySymOpnd->GetInitialType())
            {
                return !isTypeDead;
            }
            return false;
        }
        else
        {
            Assert(valueInfo->GetJsTypeSet());
            Js::EquivalentTypeSet *valueTypeSet = valueInfo->GetJsTypeSet();

            if (valueTypeSet->Contains(opndType))
            {
                return !isTypeDead;
            }
            if (propertySymOpnd->HasInitialType() && valueTypeSet->Contains(propertySymOpnd->GetInitialType()))
            {
                return !isTypeDead;
            }
            return false;
        }
    }
    else
    {
        Js::EquivalentTypeSet * opndTypeSet = propertySymOpnd->GetEquivalentTypeSet();

        if (valueInfo->GetJsType() != nullptr)
        {
            uint16 checkedTypeSetIndex;
            if (opndTypeSet->Contains(valueInfo->GetJsType(), &checkedTypeSetIndex))
            {
                return true;
            }
            return false;
        }
        else
        {
            if (IsSubsetOf(valueInfo->GetJsTypeSet(), opndTypeSet))
            {
                return true;
            }
            if (propertySymOpnd->IsMono() ?
                    valueInfo->GetJsTypeSet()->Contains(propertySymOpnd->GetFirstEquivalentType()) :
                    IsSubsetOf(opndTypeSet, valueInfo->GetJsTypeSet()))
            {
                return true;
            }
            return false;
        }
    }
}